

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O2

void Abc_RwrExpWithCut(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  uint uVar1;
  void *pvVar2;
  int i;
  uint uVar3;
  uint uVar4;
  
  Abc_RwrExpWithCut_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves,1)
  ;
  Abc_RwrExpWithCut_rec
            ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vLeaves,0);
  uVar3 = 0;
  uVar4 = 0;
  for (i = 0; i < vLeaves->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,i);
    uVar1 = *(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x14);
    uVar3 = uVar3 + ((uVar1 >> 4 & 1) != 0);
    uVar4 = uVar4 + ((uVar1 >> 5 & 1) != 0);
    *(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x14) = uVar1 & 0xffffffcf;
  }
  printf("(%d,%d:%d) ",(ulong)uVar3,(ulong)uVar4,(ulong)((uVar4 + uVar3) - vLeaves->nSize));
  return;
}

Assistant:

void Abc_RwrExpWithCut( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Abc_Obj_t * pObj;
    int i, CountA, CountB;
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, 1 );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, 0 );
    CountA = CountB = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
    {
        CountA += Abc_ObjRegular(pObj)->fMarkA;
        CountB += Abc_ObjRegular(pObj)->fMarkB;
        Abc_ObjRegular(pObj)->fMarkA = 0;
        Abc_ObjRegular(pObj)->fMarkB = 0;
    }
    printf( "(%d,%d:%d) ", CountA, CountB, CountA+CountB-Vec_PtrSize(vLeaves) );
}